

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

uint __thiscall TURBOLINECOUNT::CLineCount::countThread(CLineCount *this,int thread_number)

{
  CLineCount *pCVar1;
  int iVar2;
  long lVar3;
  void *__addr;
  void *pvVar4;
  int *piVar5;
  char *pcVar6;
  size_t __n;
  size_t __len;
  size_t sVar7;
  string *this_00;
  long __offset;
  void *__s;
  allocator<char> local_b9;
  long local_b8;
  CLineCount *local_b0;
  long local_a8;
  long local_a0;
  size_t local_98;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  lVar3 = this->m_filesize;
  local_98 = (this->m_parameters).buffersize;
  local_a8 = (long)thread_number;
  __offset = local_98 * local_a8;
  local_a0 = (long)this->m_actual_thread_count * local_98;
  __addr = (void *)0x0;
  local_b8 = 0;
  sVar7 = 0;
  local_b0 = this;
  do {
    pCVar1 = local_b0;
    __len = lVar3 - __offset;
    if (__len == 0 || lVar3 < __offset) {
      if ((__addr == (void *)0x0) || (iVar2 = munmap(__addr,sVar7), iVar2 == 0)) {
        (pCVar1->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start[local_a8] = local_b8;
        return 0;
      }
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      pcVar6 = strerror(iVar2);
      std::__cxx11::string::string<std::allocator<char>>(local_90,pcVar6,&local_b9);
      pCVar1->m_lasterror = iVar2;
      std::__cxx11::string::_M_assign((string *)&pCVar1->m_lasterrorstring);
      this_00 = local_90;
LAB_00102ab7:
      std::__cxx11::string::~string(this_00);
      pCVar1->m_thread_fail = true;
      return 0xffffffff;
    }
    if (local_b0->m_thread_fail != false) {
      return 0xffffffff;
    }
    if ((long)local_98 < (long)__len) {
      __len = local_98;
    }
    if ((__addr != (void *)0x0) && (iVar2 = munmap(__addr,sVar7), iVar2 != 0)) {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      pcVar6 = strerror(iVar2);
      std::__cxx11::string::string<std::allocator<char>>(local_50,pcVar6,&local_b9);
      pCVar1->m_lasterror = iVar2;
      std::__cxx11::string::_M_assign((string *)&pCVar1->m_lasterrorstring);
      this_00 = local_50;
      goto LAB_00102ab7;
    }
    __addr = mmap64((void *)0x0,__len,1,1,pCVar1->m_fh,__offset);
    sVar7 = __len;
    __s = __addr;
    if (__addr == (void *)0xffffffffffffffff) {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      pcVar6 = strerror(iVar2);
      std::__cxx11::string::string<std::allocator<char>>(local_70,pcVar6,&local_b9);
      pCVar1 = local_b0;
      local_b0->m_lasterror = iVar2;
      std::__cxx11::string::_M_assign((string *)&local_b0->m_lasterrorstring);
      std::__cxx11::string::~string(local_70);
      pCVar1->m_thread_fail = true;
      return 0xffffffff;
    }
    while (__n = sVar7, __n != 0) {
      pvVar4 = memchr(__s,10,__n);
      sVar7 = 0;
      if (pvVar4 != (void *)0x0) {
        local_b8 = local_b8 + 1;
        sVar7 = (long)__s + (__n - ((long)pvVar4 + 1));
        __s = (void *)((long)pvVar4 + 1);
      }
    }
    lVar3 = local_b0->m_filesize;
    if (__len + __offset == lVar3) {
      local_b8 = local_b8 + (ulong)(*(char *)((long)__addr + (__len - 1)) != '\n');
    }
    __offset = __offset + local_a0;
    sVar7 = __len;
  } while( true );
}

Assistant:

unsigned int CLineCount::countThread(int thread_number)
{
	tlc_fileoffset_t buffersize = (tlc_fileoffset_t)m_parameters.buffersize;
	tlc_fileoffset_t startoffset = buffersize * (tlc_fileoffset_t)thread_number;
	tlc_fileoffset_t stride = buffersize * m_actual_thread_count;
	tlc_fileoffset_t curoffset = startoffset;
	tlc_fileoffset_t lastmapsize = 0;
	tlc_linecount_t count = 0;
	void *mem = NULL;

	while (curoffset < m_filesize)
	{
		if (m_thread_fail)
		{
			return -1;
		}

		// Get best file mapping window size
		size_t mapsize = (size_t)std::min((m_filesize - curoffset), buffersize);

		// Map view of file
#ifdef _WIN32
		
		if (mem)
		{
			if (!UnmapViewOfFile(mem))
			{
				setLastError(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MapViewOfFile(m_filemapping, FILE_MAP_READ, (DWORD)(curoffset >> 32), (DWORD)curoffset, (SIZE_T)mapsize);
#else
		if (mem)
		{
			if(munmap(mem, lastmapsize) !=0)
			{
				LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MMAP(NULL, mapsize, PROT_READ, MAP_FILE | MAP_SHARED, m_fh, curoffset);
//		printf("%p %lld %lld\n",mem, mapsize, curoffset);
#endif		
		if (mem == MAP_FAILED)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory map failed"));
			m_thread_fail = true;
			return -1;
		}

		// Count newlines in buffer
		tlc_fileoffset_t windowoffset = 0;
		size_t windowleft = mapsize;
		char *ptr = (char *)mem;
		while (windowleft > 0)
		{
			char *ptrnext = (char *)memchr(ptr, '\n', windowleft);
			if (ptrnext)
			{
				ptrnext++;
				count++;
				windowleft -= (ptrnext - ptr);
				ptr = ptrnext;
			}
			else
			{
				windowleft = 0;
			}
		}

		// See if we need to account for end of file not ending with line terminator
		if ((curoffset + mapsize) == m_filesize)
		{
			if (*((char *)mem + (mapsize - 1)) != '\n')
			{
				count++;
			}
		}

		// Move to next buffer
		curoffset += stride;
		lastmapsize = mapsize;

//		printf("%lld\n", curoffset);
	}

	// Clean up memory map
#ifdef _WIN32
	if (mem)
	{
		if (!UnmapViewOfFile(mem))
		{
			setLastError(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#else
	if (mem)
	{
		if (munmap(mem, lastmapsize) != 0)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#endif

	// Save count for this thread
	m_threadlinecounts[thread_number] = count;

	return 0;
}